

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall testing::Matcher<const_void_*>::Matcher(Matcher<const_void_*> *this,void *value)

{
  Matcher<const_void_*> *in_RDI;
  Matcher<const_void_*> *in_stack_ffffffffffffffa8;
  EqMatcher<const_void_*> *in_stack_ffffffffffffffd8;
  
  internal::MatcherBase<const_void_*>::MatcherBase((MatcherBase<const_void_*> *)0x1158bd);
  (in_RDI->super_MatcherBase<const_void_*>)._vptr_MatcherBase = (_func_int **)&PTR__Matcher_00217630
  ;
  Eq<void_const*>(in_stack_ffffffffffffffa8);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffd8);
  operator=(in_RDI,in_stack_ffffffffffffffa8);
  ~Matcher((Matcher<const_void_*> *)0x115913);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }